

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall
ImGui::DockBuilderRemoveNodeDockedWindows(ImGui *this,ImGuiID root_id,bool clear_settings_refs)

{
  ImChunkStream<ImGuiWindowSettings> *this_00;
  ImGuiDockContext *this_01;
  ImGuiID key;
  float fVar1;
  char *pcVar2;
  ImGuiContext *ctx;
  ImGuiContext *pIVar3;
  ImGuiID *pIVar4;
  ImGuiID *pIVar5;
  ulong uVar6;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ImGuiID IVar7;
  ImGuiWindowSettings *p;
  long lVar8;
  
  pIVar3 = GImGui;
  uVar6 = (ulong)clear_settings_refs;
  IVar7 = (ImGuiID)this;
  if ((root_id != 0) && (pcVar2 = (GImGui->SettingsWindows).Buf.Data, pcVar2 != (char *)0x0)) {
    this_00 = &GImGui->SettingsWindows;
    p = (ImGuiWindowSettings *)(pcVar2 + 4);
    this_01 = &GImGui->DockContext;
    do {
      if ((IVar7 == 0) || (key = p->DockId, key == IVar7)) {
LAB_00139ce8:
        p->DockId = 0;
      }
      else if ((key != 0) &&
              (pIVar4 = (ImGuiID *)ImGuiStorage::GetVoidPtr(&this_01->Nodes,key),
              pIVar4 != (ImGuiID *)0x0)) {
        do {
          pIVar5 = pIVar4;
          pIVar4 = *(ImGuiID **)(pIVar5 + 4);
        } while (pIVar4 != (ImGuiID *)0x0);
        if (*pIVar5 == IVar7) goto LAB_00139ce8;
      }
      p = ImChunkStream<ImGuiWindowSettings>::next_chunk(this_00,p);
      uVar6 = extraout_RDX;
    } while (p != (ImGuiWindowSettings *)0x0);
  }
  if (0 < (pIVar3->Windows).Size) {
    lVar8 = 0;
    do {
      ctx = (ImGuiContext *)(pIVar3->Windows).Data[lVar8];
      if (IVar7 == 0) {
LAB_00139d74:
        fVar1 = (ctx->IO).MouseDragMaxDistanceAbs[3].y;
        DockContextProcessUndockWindow(ctx,(ImGuiWindow *)((ulong)root_id & 0xff),SUB81(uVar6,0));
        uVar6 = extraout_RDX_00;
        if (((char)root_id == '\0') && ((ctx->IO).MouseDragMaxDistanceAbs[3].y != fVar1)) {
          __assert_fail("window->DockId == backup_dock_id",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x391d,"void ImGui::DockBuilderRemoveNodeDockedWindows(ImGuiID, bool)");
        }
      }
      else {
        pIVar4 = *(ImGuiID **)&(ctx->IO).MouseDragMaxDistanceAbs[1].y;
        if (pIVar4 != (ImGuiID *)0x0) {
          do {
            pIVar5 = pIVar4;
            pIVar4 = *(ImGuiID **)(pIVar5 + 4);
          } while (pIVar4 != (ImGuiID *)0x0);
          if (*pIVar5 == IVar7) goto LAB_00139d74;
        }
        pIVar4 = *(ImGuiID **)&(ctx->IO).MouseDragMaxDistanceAbs[2].y;
        if ((pIVar4 != (ImGuiID *)0x0) && (*pIVar4 == IVar7)) goto LAB_00139d74;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pIVar3->Windows).Size);
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNodeDockedWindows(ImGuiID root_id, bool clear_settings_refs)
{
    // Clear references in settings
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    if (clear_settings_refs)
    {
        for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        {
            bool want_removal = (root_id == 0) || (settings->DockId == root_id);
            if (!want_removal && settings->DockId != 0)
                if (ImGuiDockNode* node = DockContextFindNodeByID(ctx, settings->DockId))
                    if (DockNodeGetRootNode(node)->ID == root_id)
                        want_removal = true;
            if (want_removal)
                settings->DockId = 0;
        }
    }

    // Clear references in windows
    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        bool want_removal = (root_id == 0) || (window->DockNode && DockNodeGetRootNode(window->DockNode)->ID == root_id) || (window->DockNodeAsHost && window->DockNodeAsHost->ID == root_id);
        if (want_removal)
        {
            const ImGuiID backup_dock_id = window->DockId;
            IM_UNUSED(backup_dock_id);
            DockContextProcessUndockWindow(ctx, window, clear_settings_refs);
            if (!clear_settings_refs)
                IM_ASSERT(window->DockId == backup_dock_id);
        }
    }
}